

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-solver.cc
# Opt level: O2

bool __thiscall mp::NLSolver::Solve(NLSolver *this,string *solver,string *solver_opts)

{
  int __val;
  bool bVar1;
  string call;
  string local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  if (((this->filestub_)._M_string_length == 0) || (solver->_M_string_length == 0)) {
    std::__cxx11::string::assign((char *)&this->err_msg_);
    bVar1 = false;
  }
  else {
    std::__cxx11::string::string((string *)&call,(string *)solver);
    std::__cxx11::string::push_back((char)&call);
    std::__cxx11::string::append((string *)&call);
    std::__cxx11::string::append((char *)&call);
    std::__cxx11::string::append((string *)&call);
    __val = system(call._M_dataplus._M_p);
    bVar1 = __val == 0;
    if (!bVar1) {
      std::operator+(&local_a0,"NLSolver: call \"",&call);
      std::operator+(&local_80,&local_a0,"\" failed (code ");
      std::__cxx11::to_string(&local_c0,__val);
      std::operator+(&local_60,&local_80,&local_c0);
      std::operator+(&local_40,&local_60,").");
      std::__cxx11::string::operator=((string *)&this->err_msg_,(string *)&local_40);
      std::__cxx11::string::~string((string *)&local_40);
      std::__cxx11::string::~string((string *)&local_60);
      std::__cxx11::string::~string((string *)&local_c0);
      std::__cxx11::string::~string((string *)&local_80);
      std::__cxx11::string::~string((string *)&local_a0);
    }
    std::__cxx11::string::~string((string *)&call);
  }
  return bVar1;
}

Assistant:

bool NLSolver::Solve(const std::string& solver,
                  const std::string& solver_opts) {
  if (GetFileStub().empty())
    return (err_msg_="NLSolver: provide filestub.", false);
  if (solver.empty())
    return (err_msg_="NLSolver: provide solver.", false);
  auto call = solver;
#ifdef _WIN32
  const std::string ending{".exe"};
  if (solver.length() < ending.length()
      || (0 != solver.compare(solver.length() - ending.length(), ending.length(), ending)))
    call += ending;
#endif  // _WIN32
  call += ' ';
  call += GetFileStub();
  call += " -AMPL ";
  call += solver_opts;
  if (auto status = std::system(call.c_str()))
    return (err_msg_="NLSolver: call \""
        + call + "\" failed (code "
        + std::to_string(status) + ").", false);
  return true;
}